

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O1

int invertMatrixTest(void)

{
  Scalar *dst_ptr;
  double *pdVar1;
  ostream *poVar2;
  long *plVar3;
  Index in_RCX;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  Matrix4 hi;
  Matrix4 h;
  Matrix3 rt;
  Matrix3 R1;
  assign_op<double,_double> local_249;
  double local_248 [2];
  double local_238 [16];
  double local_1b8 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_138;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_f0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_70;
  
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,4,1,0,4,1>>
            ((type *)local_1b8,(ProbabilityLawSimulation *)0x4,1,in_RCX,-1.0,1.0);
  auVar6._8_8_ = local_1b8[1];
  auVar6._0_8_ = local_1b8[0];
  auVar9._8_8_ = local_1b8[3];
  auVar9._0_8_ = local_1b8[2];
  auVar12._0_8_ =
       local_1b8[3] * local_1b8[3] + local_1b8[1] * local_1b8[1] +
       local_1b8[2] * local_1b8[2] + local_1b8[0] * local_1b8[0];
  if (0.0 < auVar12._0_8_) {
    auVar12._8_8_ = 0;
    auVar12 = sqrtpd(auVar12,auVar12);
    auVar13._0_8_ = auVar12._0_8_;
    auVar13._8_8_ = auVar13._0_8_;
    auVar6 = divpd(auVar6,auVar13);
    auVar9 = divpd(auVar9,auVar13);
  }
  dVar5 = auVar6._0_8_;
  dVar7 = auVar6._8_8_;
  dVar11 = dVar7 + dVar7;
  dVar8 = auVar9._0_8_;
  dVar16 = dVar8 + dVar8;
  dVar10 = auVar9._8_8_;
  dVar15 = dVar5 * (dVar5 + dVar5);
  dVar14 = (dVar5 + dVar5) * dVar10;
  pdVar1 = &local_a8;
  local_b8 = 1.0 - (dVar11 * dVar7 + dVar16 * dVar8);
  local_a0 = dVar5 * dVar11 - dVar10 * dVar16;
  local_88 = dVar11 * dVar10 + dVar5 * dVar16;
  dStack_b0 = dVar5 * dVar11 + dVar10 * dVar16;
  local_98 = 1.0 - (dVar16 * dVar8 + dVar15);
  local_80 = dVar7 * dVar16 - dVar14;
  local_a8 = dVar5 * dVar16 - dVar11 * dVar10;
  local_90 = dVar7 * dVar16 + dVar14;
  local_78 = 1.0 - (dVar11 * dVar7 + dVar15);
  local_1b8[0] = 1.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  local_1b8[3] = 0.0;
  local_1b8[4] = 0.0;
  local_1b8[5] = 1.0;
  local_1b8[6] = 0.0;
  local_1b8[7] = 0.0;
  local_1b8[8] = 0.0;
  local_1b8[9] = 0.0;
  local_1b8[10] = 1.0;
  local_1b8[0xb] = 0.0;
  local_1b8[0xc] = 0.0;
  local_1b8[0xd] = 0.0;
  local_1b8[0xe] = 0.0;
  local_1b8[0xf] = 1.0;
  lVar4 = 0x10;
  do {
    dVar5 = pdVar1[-1];
    *(double *)((long)local_238 + lVar4 + 0x70) = pdVar1[-2];
    *(double *)((long)local_1b8 + lVar4 + -8) = dVar5;
    *(double *)((long)local_1b8 + lVar4) = *pdVar1;
    pdVar1 = pdVar1 + 3;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x70);
  local_248[0] = (double)stateObservation::tools::ProbabilityLawSimulation::getUniformScalar
                                   (-1.0,1.0);
  local_248[1] = (double)stateObservation::tools::ProbabilityLawSimulation::getUniformScalar
                                   (-1.0,1.0);
  local_1b8[0xe] =
       (double)stateObservation::tools::ProbabilityLawSimulation::getUniformScalar(-1.0,1.0);
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       local_1b8 + 0xc;
  local_1b8[0xc] = local_248[0];
  local_1b8[0xd] = local_248[1];
  local_238[0] = 1.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  local_238[3] = 0.0;
  local_238[4] = 0.0;
  local_238[5] = 1.0;
  local_238[6] = 0.0;
  local_238[7] = 0.0;
  local_238[8] = 0.0;
  local_238[9] = 0.0;
  local_238[10] = 1.0;
  local_238[0xb] = 0.0;
  local_238[0xc] = 0.0;
  local_238[0xd] = 0.0;
  local_238[0xe] = 0.0;
  local_238[0xf] = 1.0;
  pdVar1 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_1b8[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_1b8[4];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_1b8[8];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_1b8[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_1b8[5];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_1b8[9];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_1b8[2];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_1b8[6];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_1b8[10];
  lVar4 = 0x10;
  do {
    dVar5 = pdVar1[-1];
    *(double *)((long)local_248 + lVar4) = ((plain_array<double,_9,_0,_0> *)(pdVar1 + -2))->array[0]
    ;
    *(double *)((long)local_238 + lVar4 + -8) = dVar5;
    *(double *)((long)local_238 + lVar4) = *pdVar1;
    lVar4 = lVar4 + 0x20;
    pdVar1 = pdVar1 + 3;
  } while (lVar4 != 0x70);
  local_70.m_lhs.m_xpr = &local_138;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
  m_value = 3;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
  m_value = 1;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
  m_value = 3;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  m_outerStride = 4;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       local_238 + 0xc;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
  m_value = 3;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride = 4
  ;
  local_f0.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)local_238;
  local_70.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)local_1b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            (&local_f0,&local_70,&local_249,(type)0x0);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_238);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_1b8;
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                             &local_138);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_238;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_1b8;
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                              *)&local_138);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int invertMatrixTest() // tested OK
{
  stateObservation::Quaternion q(tools::ProbabilityLawSimulation::getUniformMatrix<Vector4>());

  q.normalize();

  Matrix3 R1(q.matrix());

  Matrix4 h(Matrix4::Identity());

  h.block(0, 0, 3, 3) = R1;
  h.block(0, 3, 3, 1) = tools::ProbabilityLawSimulation::getUniformMatrix<Vector3>();

  Matrix4 hi = kine::invertHomoMatrix(h);

  std::cout << h << std::endl << std::endl;
  std::cout << hi << std::endl << std::endl;
  std::cout << h.inverse() << std::endl << std::endl;
  std::cout << hi * h << std::endl << std::endl;
  return 0;
}